

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status
filemgr_read(filemgr *file,bid_t bid,void *buf,err_log_callback *log_callback,
            bool read_on_cache_miss)

{
  uint uVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  fdb_status fVar5;
  fdb_status fVar6;
  plock_entry_t *plock_entry;
  __int_type_conflict _Var7;
  ulong uVar8;
  size_t line_number;
  char *pcVar9;
  long lVar10;
  long *in_FS_OFFSET;
  bool bVar11;
  char *format;
  char *pcVar12;
  bid_t bid_local;
  ulong local_80;
  int local_74;
  plock_entry_t *local_70;
  long local_68;
  bid_t is_writer;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  bid_local = bid;
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    filemgr_read_cold_1();
  }
  if ((char)in_FS_OFFSET[-0x13] == '\0') {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_manager;
    *(undefined1 *)(in_FS_OFFSET + -0x18) = 0;
    std::function<void_()>::function
              ((function<void_()> *)(*in_FS_OFFSET + -0xb8),(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    __cxa_thread_atexit(FdbGcFunc::~FdbGcFunc,*in_FS_OFFSET + -0xc0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13) = 1;
  }
  pcVar9 = (char *)(file->blocksize * bid_local);
  pcVar12 = (char *)(file->pos).super___atomic_base<unsigned_long>._M_i;
  if (pcVar12 <= pcVar9) {
    line_number = 0x7fd;
    format = 
    "Read error: read offset %lu exceeds the file\'s current offset %lu in a database file \'%s\'\n"
    ;
LAB_001182c0:
    fdb_log_impl(log_callback,2,FDB_RESULT_READ_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_read",line_number,format,pcVar9,pcVar12);
    return FDB_RESULT_READ_FAIL;
  }
  if (global_config.ncacheblock < 1) {
    if (!read_on_cache_miss) {
      line_number = 0x886;
      pcVar12 = file->filename;
      format = "Read error: BID %lu in a database file \'%s\':block cache is not enabled.\n";
      pcVar9 = (char *)bid_local;
      goto LAB_001182c0;
    }
    uVar8 = filemgr_read_block(file,buf,bid_local);
    if (uVar8 != file->blocksize) {
      _log_errno_str(file->ops,log_callback,(fdb_status)uVar8,"READ",file->filename);
      fVar5 = FDB_RESULT_READ_FAIL;
      if ((long)uVar8 < 0) {
        fVar5 = (fdb_status)uVar8;
      }
      fdb_log_impl(log_callback,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x892,
                   "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read (block cache disabled).\n"
                   ,bid_local,file->filename,uVar8);
      if ((log_callback != (err_log_callback *)0x0) &&
         (log_callback->callback != (fdb_log_callback)0x0)) {
        return fVar5;
      }
      dbg_print_buf(buf,(ulong)file->blocksize,true,0x10);
      return fVar5;
    }
    if (*(char *)((long)buf + ((ulong)file->blocksize - 1)) == -1) {
      uVar1 = *(uint *)((long)buf + 8);
      *(undefined8 *)((long)buf + 8) = 0xffffffffffffffff;
      bVar11 = perform_integrity_check
                         ((uint8_t *)buf,(ulong)file->blocksize,
                          uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                          uVar1 << 0x18,file->crc_mode);
      if (!bVar11) {
        fVar5 = FDB_RESULT_CHECKSUM_ERROR;
        bVar11 = false;
        goto LAB_00118338;
      }
    }
    fVar5 = FDB_RESULT_SUCCESS;
    bVar11 = true;
LAB_00118338:
    fVar6 = FDB_RESULT_SUCCESS;
    if (!bVar11) {
      _log_errno_str(file->ops,log_callback,fVar5,"READ",file->filename);
      fdb_log_impl(log_callback,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x8a1,
                   "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x (block cache disabled)\n"
                   ,bid_local,file->filename,
                   (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1)));
      fVar6 = fVar5;
      if ((log_callback == (err_log_callback *)0x0) ||
         (log_callback->callback == (fdb_log_callback)0x0)) {
        dbg_print_buf(buf,(ulong)file->blocksize,true,0x10);
      }
    }
    return fVar6;
  }
  is_writer = 0;
  iVar3 = bcache_read(file,bid_local,buf);
  if (iVar3 == 0) {
    plock_entry = plock_lock(&file->plock,&bid_local,&is_writer);
    iVar4 = bcache_read(file,bid_local,buf);
    bVar11 = iVar4 == 0;
  }
  else {
    plock_entry = (plock_entry_t *)0x0;
    bVar11 = false;
  }
  fVar5 = FDB_RESULT_SUCCESS;
  if (!bVar11) goto LAB_0011883d;
  if (!read_on_cache_miss) {
    if (iVar3 == 0) {
      plock_unlock(&file->plock,plock_entry);
    }
    line_number = 0x821;
    pcVar12 = file->filename;
    format = 
    "Read error: BID %lu in a database file \'%s\' doesn\'t exist in the cache and read_on_cache_miss flag is turned on.\n"
    ;
    pcVar9 = (char *)bid_local;
    goto LAB_001182c0;
  }
  local_70 = plock_entry;
  if ((file->latest_filesize).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize <=
      bid_local) {
    lVar10 = 0;
    do {
      _Var7 = (*file->ops->goto_eof)(file->fd);
      LOCK();
      (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var7;
      UNLOCK();
      uVar8 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i;
      uVar1 = file->blocksize;
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
      if (bVar11) {
        usleep(1000);
      }
    } while (uVar8 / uVar1 <= bid_local);
  }
  if (((void *)in_FS_OFFSET[-0x1a] == (void *)0x0) || (global_config.num_blocks_readahead == 0)) {
    uVar8 = filemgr_read_block(file,buf,bid_local);
    plock_entry = local_70;
    if (uVar8 == file->blocksize) {
      fVar5 = _filemgr_crc32_check(file,buf);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        local_74 = iVar3;
        if ((global_config.do_not_cache_doc_blocks != true) ||
           (fVar6 = global_config.blocksize,
           *(char *)((long)buf + ((ulong)file->blocksize - 1)) == -1)) {
          fVar6 = bcache_write(file,bid_local,buf,BCACHE_REQ_CLEAN,false,false);
        }
        iVar4 = global_config.blocksize;
        if (fVar6 == global_config.blocksize) {
          fVar5 = FDB_RESULT_SUCCESS;
        }
        else {
          local_68 = (long)fVar6;
          if (local_74 == 0) {
            plock_unlock(&file->plock,plock_entry);
          }
          _log_errno_str(file->ops,log_callback,fVar6,"WRITE",file->filename);
          local_80 = 0xfffffffc;
          if (fVar6 < FDB_RESULT_SUCCESS) {
            local_80 = (ulong)(uint)fVar6;
          }
          fdb_log_impl(log_callback,2,(fdb_status)local_80,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_read",0x876,
                       "Read error: BID %lu in a database file \'%s\' is not written in cache correctly: only %d bytes written.\n"
                       ,bid_local,file->filename,local_68);
          if ((log_callback == (err_log_callback *)0x0) ||
             (log_callback->callback == (fdb_log_callback)0x0)) {
            dbg_print_buf(buf,(ulong)file->blocksize,true,0x10);
          }
          fVar5 = (fdb_status)local_80;
        }
        iVar3 = local_74;
        fVar2 = fVar5;
        if (fVar6 == iVar4) goto LAB_00118830;
        bVar11 = false;
        goto LAB_00118835;
      }
      _log_errno_str(file->ops,log_callback,fVar5,"READ",file->filename);
      if (iVar3 == 0) {
        plock_unlock(&file->plock,plock_entry);
      }
      local_80 = (ulong)(uint)fVar5;
      fdb_log_impl(log_callback,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x85b,
                   "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x\n",
                   bid_local,file->filename,
                   (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1)));
    }
    else {
      _log_errno_str(file->ops,log_callback,(fdb_status)uVar8,"READ",file->filename);
      if (iVar3 == 0) {
        plock_unlock(&file->plock,plock_entry);
      }
      local_80 = 0xfffffffb;
      if ((long)uVar8 < 0) {
        local_80 = uVar8 & 0xffffffff;
      }
      fdb_log_impl(log_callback,2,(fdb_status)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x849,
                   "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read, file size %zu.\n"
                   ,bid_local,file->filename,uVar8,
                   (file->latest_filesize).super___atomic_base<unsigned_long>._M_i);
    }
    if ((log_callback == (err_log_callback *)0x0) ||
       (log_callback->callback == (fdb_log_callback)0x0)) {
      dbg_print_buf(buf,(ulong)file->blocksize,true,0x10);
    }
    bVar11 = false;
    fVar5 = (fdb_status)local_80;
  }
  else {
    fVar5 = filemgr_do_readahead(file,bid_local,buf,(void *)in_FS_OFFSET[-0x1a],log_callback);
    plock_entry = local_70;
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) {
LAB_00118830:
      fVar5 = fVar2;
      bVar11 = true;
    }
    else {
      bVar11 = false;
    }
  }
LAB_00118835:
  if (!bVar11) {
    return fVar5;
  }
LAB_0011883d:
  if (iVar3 != 0) {
    return fVar5;
  }
  plock_unlock(&file->plock,plock_entry);
  return fVar5;
}

Assistant:

fdb_status filemgr_read(struct filemgr *file, bid_t bid, void *buf,
                        err_log_callback *log_callback,
                        bool read_on_cache_miss)
{
    thread_local void* buf_aligned = alloc_buf_for_readahead();
    thread_local FdbGcFunc gc([&](){ free_align(buf_aligned); });

    size_t lock_no;
    ssize_t r;
    uint64_t pos = bid * file->blocksize;
    fdb_status status = FDB_RESULT_SUCCESS;
    uint64_t curr_pos = atomic_get_uint64_t(&file->pos);

    if (pos >= curr_pos) {
        const char *msg = "Read error: read offset %" _F64 " exceeds the file's "
                          "current offset %" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, pos, curr_pos, file->filename);
        return FDB_RESULT_READ_FAIL;
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        plock_entry_t *plock_entry = NULL;
        bid_t is_writer = 0;
        bool locked = false; (void)locked;

        r = bcache_read(file, bid, buf);
        if (r == 0) {
            // Cache miss, grab lock and find once again.

            // WARNING:
            //   Regardless of writability, we SHOULD grab lock
            //   as reused blocks are immutable but writers can overwrite it
            //   and can update block cache sooner. Once race condition happens,
            //   reader may overwrite it using previous block.
            plock_entry = plock_lock(&file->plock, &bid, &is_writer);
            locked = true;
            r = bcache_read(file, bid, buf);
        }

        if (r == 0) {
            // Still cache miss, read from file.
            if (!read_on_cache_miss) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                    "doesn't exist in the cache and read_on_cache_miss "
                    "flag is turned on.\n";
                fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                        msg, bid, file->filename);
                return FDB_RESULT_READ_FAIL;
            }

            uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                                    file->blocksize;
            size_t wait_count = 0;
            while (bid >= total_blocks) {
                // This means blocks are asynchronously flushed from cache.
                // Should update file size.
                cs_off_t exp_filesize = file->ops->goto_eof(file->fd);
                atomic_init_uint64_t(&file->latest_filesize, exp_filesize);
                total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                               file->blocksize;
                if (wait_count++) {
                    usleep(1000);
                }
            }

            if ( buf_aligned &&
                 global_config.num_blocks_readahead ) {
                // Direct-IO mode, do read-ahead.
                status = filemgr_do_readahead(file, bid, buf, buf_aligned, log_callback);
                if (status != FDB_RESULT_SUCCESS) return status;

            } else {
                // if normal file, just read a block
                r = filemgr_read_block(file, buf, bid);
                if (r != (ssize_t)file->blocksize) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "READ", file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: BID %" _F64
                        " in a database file '%s' is not read correctly: "
                        "only %d bytes read, file size %zu.\n";
                    status = r < 0 ? (fdb_status)r : FDB_RESULT_READ_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r,
                            atomic_get_uint64_t(&file->latest_filesize));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                status = _filemgr_crc32_check(file, buf);
                if (status != FDB_RESULT_SUCCESS) {
                    _log_errno_str(file->ops, log_callback, status, "READ",
                            file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: checksum error on BID %" _F64
                        " in a database file '%s' : marker %x\n";
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid,
                            file->filename, *((uint8_t*)buf + file->blocksize-1));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
                if ( global_config.do_not_cache_doc_blocks &&
                     marker != BLK_MARKER_BNODE ) {
                    // If caching option is ON, and not a B-tree block,
                    // we do not put it into cache.
                    r = global_config.blocksize;
                } else {
                    r = bcache_write(file, bid, buf, BCACHE_REQ_CLEAN, false, false);
                }

                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "WRITE", file->filename);
                    const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                        "is not written in cache correctly: only %d bytes written.\n";
                    status = r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r);
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }
            }
        }
        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else {
        if (!read_on_cache_miss) {
            const char *msg = "Read error: BID %" _F64 " in a database file '%s':"
                "block cache is not enabled.\n";
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                    msg, bid, file->filename);
            return FDB_RESULT_READ_FAIL;
        }

        r = filemgr_read_block(file, buf, bid);
        if (r != (ssize_t)file->blocksize) {
            _log_errno_str(file->ops, log_callback, (fdb_status) r, "READ",
                           file->filename);
            const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                "is not read correctly: only %d bytes read (block cache disabled).\n";
            status = (r < 0)? (fdb_status)r : FDB_RESULT_READ_FAIL;
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid, file->filename, r);
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

        status = _filemgr_crc32_check(file, buf);
        if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ",
                           file->filename);
            const char *msg = "Read error: checksum error on BID %" _F64 " in a database file '%s' "
                ": marker %x (block cache disabled)\n";
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid,
                    file->filename, *((uint8_t*)buf + file->blocksize-1));
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

    }
    return status;
}